

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int ncnn::reduction_post_process<ncnn::post_process_log<float>>(Mat *a,float coeff,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  uint uVar5;
  ulong uVar6;
  int i;
  ulong uVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  
  uVar3 = a->dims;
  uVar4 = (ulong)uVar3;
  if (uVar3 == 2) {
    uVar3 = a->h * a->w;
    pvVar8 = a->data;
    uVar9 = 0;
    uVar6 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar6 = uVar9;
    }
    for (; uVar3 = (uint)uVar4, uVar6 != uVar9; uVar9 = uVar9 + 1) {
      fVar11 = logf(*(float *)((long)pvVar8 + uVar9 * 4));
      *(float *)((long)pvVar8 + uVar9 * 4) = fVar11;
      uVar4 = extraout_RAX_00;
    }
  }
  else if (uVar3 == 1) {
    pvVar8 = a->data;
    uVar9 = 0;
    uVar6 = (ulong)(uint)a->w;
    if (a->w < 1) {
      uVar6 = uVar9;
    }
    for (; uVar3 = (uint)uVar4, uVar6 != uVar9; uVar9 = uVar9 + 1) {
      fVar11 = logf(*(float *)((long)pvVar8 + uVar9 * 4));
      *(float *)((long)pvVar8 + uVar9 * 4) = fVar11;
      uVar4 = extraout_RAX;
    }
  }
  else {
    uVar3 = uVar3 - 3;
    uVar4 = (ulong)uVar3;
    if (uVar3 < 2) {
      uVar3 = a->c;
      uVar5 = a->h * a->w * a->d;
      pvVar8 = a->data;
      if (uVar3 == 1) {
        uVar9 = 0;
        uVar6 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar6 = uVar9;
        }
        for (; uVar3 = (uint)uVar4, uVar6 != uVar9; uVar9 = uVar9 + 1) {
          fVar11 = logf(*(float *)((long)pvVar8 + uVar9 * 4));
          *(float *)((long)pvVar8 + uVar9 * 4) = fVar11;
          uVar4 = extraout_RAX_01;
        }
      }
      else {
        sVar1 = a->cstep;
        sVar2 = a->elemsize;
        uVar9 = 0;
        uVar6 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar6 = uVar9;
        }
        uVar10 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar10 = uVar9;
        }
        for (; uVar3 = (uint)uVar4, uVar9 != uVar10; uVar9 = uVar9 + 1) {
          for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
            fVar11 = logf(*(float *)((long)pvVar8 + uVar7 * 4));
            *(float *)((long)pvVar8 + uVar7 * 4) = fVar11;
            uVar4 = extraout_RAX_02;
          }
          pvVar8 = (void *)((long)pvVar8 + sVar1 * sVar2);
        }
      }
    }
  }
  return uVar3;
}

Assistant:

static int reduction_post_process(Mat& a, float coeff, const Option& opt)
{
    MathOp mathop;

    int dims = a.dims;
    if (dims == 1)
    {
        int w = a.w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < w; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 2)
    {
        int size = a.w * a.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 3 || dims == 4)
    {
        int c = a.c;
        int size = a.w * a.h * a.d;
        if (c == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < size; i++)
                a[i] = mathop(a[i]) * coeff;
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                float* outptr = a.channel(q);
                for (int i = 0; i < size; i++)
                    outptr[i] = mathop(outptr[i]) * coeff;
            }
        }
    }

    return 0;
}